

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWPackage.cxx
# Opt level: O0

string * __thiscall
cmCPackIFWPackage::DependenceStruct::NameWithCompare_abi_cxx11_
          (string *__return_storage_ptr__,DependenceStruct *this)

{
  DependenceStruct *this_local;
  string *result;
  
  if ((this->Compare).Type == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
    if ((this->Compare).Type == 3) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"<=");
    }
    else if ((this->Compare).Type == 5) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,">=");
    }
    else if ((this->Compare).Type == 2) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"<");
    }
    else if ((this->Compare).Type == 1) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"=");
    }
    else if ((this->Compare).Type == 4) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,">");
    }
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,(string *)&(this->Compare).Value);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCPackIFWPackage::DependenceStruct::NameWithCompare() const
{
  if (Compare.Type == CompareNone) return Name;

  std::string result = Name;

  if (Compare.Type == CompareLessOrEqual)
    {
    result += "<=";
    }
  else if (Compare.Type == CompareGreaterOrEqual)
    {
    result += ">=";
    }
  else if (Compare.Type == CompareLess)
    {
    result += "<";
    }
  else if (Compare.Type == CompareEqual)
    {
    result += "=";
    }
  else if (Compare.Type == CompareGreater)
    {
    result += ">";
    }

  result += Compare.Value;

  return result;
}